

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O1

void __thiscall glu::sl::ShaderParser::parseValue(ShaderParser *this,ValueBlock *valueBlock)

{
  Token TVar1;
  DataType basicType;
  undefined8 extraout_RAX;
  ShaderParser *this_00;
  ShaderParser *this_01;
  Value value;
  string valueName;
  undefined1 local_b0 [32];
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  pointer local_78;
  pointer pEStack_70;
  pointer local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  VarType local_40;
  
  local_58 = 0;
  local_50 = 0;
  TVar1 = this->m_curToken;
  local_60 = &local_50;
  if (TVar1 == TOKEN_OUTPUT) {
    valueBlock = (ValueBlock *)&valueBlock->outputs;
  }
  else if (TVar1 != TOKEN_INPUT) {
    if (TVar1 != TOKEN_UNIFORM) goto LAB_0056bef3;
    valueBlock = (ValueBlock *)&valueBlock->uniforms;
  }
  this_01 = this;
  advanceToken(this);
  this_00 = (ShaderParser *)(ulong)this->m_curToken;
  basicType = mapDataTypeToken(this_01,this->m_curToken);
  if (basicType == TYPE_INVALID) {
LAB_0056beaf:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   "unexpected token when parsing value data type: ",&this->m_curTokenStr);
    parseError(this,(string *)local_b0);
  }
  else {
    advanceToken(this);
    if (this->m_curToken == TOKEN_STRING) {
      parseStringLiteral_abi_cxx11_
                ((string *)local_b0,this_00,(this->m_curTokenStr)._M_dataplus._M_p);
      std::__cxx11::string::operator=((string *)&local_60,(string *)local_b0);
      if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
LAB_0056bd20:
      advanceToken(this);
      assumeToken(this,TOKEN_ASSIGN);
      advanceToken(this);
      VarType::VarType((VarType *)local_b0);
      local_90 = 0;
      local_88._M_local_buf[0] = '\0';
      local_78 = (pointer)0x0;
      pEStack_70 = (pointer)0x0;
      local_68 = (pointer)0x0;
      local_b0._24_8_ = &local_88;
      std::__cxx11::string::_M_assign((string *)(local_b0 + 0x18));
      VarType::VarType(&local_40,basicType,PRECISION_LAST);
      VarType::operator=((VarType *)local_b0,&local_40);
      VarType::~VarType(&local_40);
      std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::push_back
                (&valueBlock->inputs,(value_type *)local_b0);
      if (local_78 != (pointer)0x0) {
        operator_delete(local_78,(long)local_68 - (long)local_78);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._24_8_ != &local_88) {
        operator_delete((void *)local_b0._24_8_,
                        CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) + 1)
        ;
      }
      VarType::~VarType((VarType *)local_b0);
      if (this->m_curToken != TOKEN_LEFT_BRACKET) {
        parseValueElement(this,basicType,
                          (valueBlock->inputs).
                          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
                          _M_impl.super__Vector_impl_data._M_finish + -1);
LAB_0056be51:
        assumeToken(this,TOKEN_SEMI_COLON);
        advanceToken(this);
        if (local_60 != &local_50) {
          operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
        }
        return;
      }
      assumeToken(this,TOKEN_LEFT_BRACKET);
      advanceToken(this);
      while( true ) {
        parseValueElement(this,basicType,
                          (valueBlock->inputs).
                          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
                          _M_impl.super__Vector_impl_data._M_finish + -1);
        if (this->m_curToken != TOKEN_VERTICAL_BAR) break;
        advanceToken(this);
      }
      if (this->m_curToken == TOKEN_RIGHT_BRACKET) {
        assumeToken(this,TOKEN_RIGHT_BRACKET);
        advanceToken(this);
        goto LAB_0056be51;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     "unexpected token in value element array: ",&this->m_curTokenStr);
      parseError(this,(string *)local_b0);
      goto LAB_0056beaf;
    }
    if (this->m_curToken == TOKEN_IDENTIFIER) {
      std::__cxx11::string::_M_assign((string *)&local_60);
      goto LAB_0056bd20;
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 "unexpected token when parsing value name: ",&this->m_curTokenStr);
  parseError(this,(string *)local_b0);
LAB_0056bef3:
  local_b0._0_8_ = local_b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,"unexpected token encountered when parsing value classifier","");
  parseError(this,(string *)local_b0);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ShaderParser::parseValue (ValueBlock& valueBlock)
{
	PARSE_DBG(("      parseValue()\n"));

	// Parsed results.
	vector<Value>*	dstBlock	= DE_NULL;
	DataType		basicType	= TYPE_LAST;
	std::string		valueName;

	// Parse storage.
	if (m_curToken == TOKEN_UNIFORM)
		dstBlock = &valueBlock.uniforms;
	else if (m_curToken == TOKEN_INPUT)
		dstBlock = &valueBlock.inputs;
	else if (m_curToken == TOKEN_OUTPUT)
		dstBlock = &valueBlock.outputs;
	else
		parseError(string("unexpected token encountered when parsing value classifier"));
	advanceToken();

	// Parse data type.
	basicType = mapDataTypeToken(m_curToken);
	if (basicType == TYPE_INVALID)
		parseError(string("unexpected token when parsing value data type: " + m_curTokenStr));
	advanceToken();

	// Parse value name.
	if (m_curToken == TOKEN_IDENTIFIER || m_curToken == TOKEN_STRING)
	{
		if (m_curToken == TOKEN_IDENTIFIER)
			valueName = m_curTokenStr;
		else
			valueName = parseStringLiteral(m_curTokenStr.c_str());
	}
	else
		parseError(string("unexpected token when parsing value name: " + m_curTokenStr));
	advanceToken();

	// Parse assignment operator.
	advanceToken(TOKEN_ASSIGN);

	{
		Value value;
		value.name	= valueName;
		value.type	= VarType(basicType, PRECISION_LAST);
		dstBlock->push_back(value);
	}

	// Parse actual value.
	if (m_curToken == TOKEN_LEFT_BRACKET) // value list
	{
		int	arrayLength	= 0; // \todo [2015-08-03 pyry] Currently unused

		advanceToken(TOKEN_LEFT_BRACKET);

		for (;;)
		{
			parseValueElement(basicType, dstBlock->back());
			arrayLength++;

			if (m_curToken == TOKEN_RIGHT_BRACKET)
				break;
			else if (m_curToken == TOKEN_VERTICAL_BAR)
			{
				advanceToken();
				continue;
			}
			else
				parseError(string("unexpected token in value element array: " + m_curTokenStr));
		}

		advanceToken(TOKEN_RIGHT_BRACKET);
	}
	else //  single elements
	{
		parseValueElement(basicType, dstBlock->back());
	}

	advanceToken(TOKEN_SEMI_COLON); // end of declaration
}